

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::ReadNumericExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *this,char code,
          bool ignore_zero)

{
  int iVar1;
  Reference RVar2;
  NumericExpr NVar3;
  undefined7 in_register_00000031;
  int iVar4;
  bool bVar5;
  
  iVar4 = (int)CONCAT71(in_register_00000031,code);
  switch(iVar4) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    ReadConstant(this,code);
    break;
  case 0x6f:
    iVar4 = ReadOpCode(this);
    NVar3 = ReadNumericExpr(this,iVar4);
    return NVar3;
  case 0x76:
    RVar2 = DoReadReference(this);
    return RVar2;
  default:
    if (iVar4 == 0x66) {
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      iVar1 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      iVar4 = 0;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        ReadSymbolicExpr(this);
      }
      return 0;
    }
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
    TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x213272);
  }
  return 0;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}